

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

DWORD vlinec1(void)

{
  int iVar1;
  lighttable_t *plVar2;
  fixed_t fVar3;
  BYTE *pBVar4;
  int iVar5;
  int pitch;
  int bits;
  BYTE *dest;
  BYTE *source;
  int count;
  BYTE *colormap;
  DWORD frac;
  DWORD fracstep;
  
  iVar5 = vlinebits;
  pBVar4 = dc_source;
  fVar3 = dc_iscale;
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  colormap._0_4_ = dc_texturefrac;
  source._4_4_ = dc_count;
  _pitch = dc_dest;
  do {
    *_pitch = plVar2[pBVar4[(DWORD)colormap >> ((byte)iVar5 & 0x1f)]];
    colormap._0_4_ = fVar3 + (DWORD)colormap;
    _pitch = _pitch + iVar1;
    source._4_4_ = source._4_4_ + -1;
  } while (source._4_4_ != 0);
  return (DWORD)colormap;
}

Assistant:

DWORD vlinec1 ()
{
	DWORD fracstep = dc_iscale;
	DWORD frac = dc_texturefrac;
	BYTE *colormap = dc_colormap;
	int count = dc_count;
	const BYTE *source = dc_source;
	BYTE *dest = dc_dest;
	int bits = vlinebits;
	int pitch = dc_pitch;

	do
	{
		*dest = colormap[source[frac>>bits]];
		frac += fracstep;
		dest += pitch;
	} while (--count);

	return frac;
}